

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall tonk::SessionOutgoing::PostRetransmit(SessionOutgoing *this,bool *messageSent)

{
  ostringstream *this_00;
  undefined8 *puVar1;
  SiameseResult SVar2;
  _func_int **pp_Var3;
  OutputWorker *this_01;
  OutgoingQueuedDatagram *datagram;
  undefined1 *in_RDX;
  uint uVar4;
  allocator local_1c9;
  SiameseOriginalPacket original;
  LogStringBuffer local_1b8;
  
  *in_RDX = 0;
  if ((messageSent[0x2a4] & 1U) == 0) {
    puVar1 = *(undefined8 **)(messageSent + 0x208);
    if (*(int *)(puVar1 + 1) < 4) {
      local_1b8.ChannelName = (char *)*puVar1;
      this_00 = &local_1b8.LogStream;
      local_1b8.LogLevel = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,(string *)(puVar1 + 7));
      std::operator<<((ostream *)this_00,"PostRetransmit ignored before peer address is known");
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
  }
  else if (0 < *(int *)(*(long *)(messageSent + 0x220) + 0x18)) {
    SVar2 = siamese_encoder_retransmit(*(SiameseEncoder *)(messageSent + 0x2d0),&original);
    if (SVar2 == Siamese_Success) {
      local_1b8.ChannelName = messageSent + 8;
      uVar4 = original.DataBytes + 0x3f;
      std::recursive_mutex::lock((recursive_mutex *)local_1b8.ChannelName);
      datagram = (OutgoingQueuedDatagram *)
                 pktalloc::Allocator::Allocate((Allocator *)(messageSent + 0x30),uVar4);
      Locker::~Locker((Locker *)&local_1b8);
      if (datagram == (OutgoingQueuedDatagram *)0x0) {
        Result::OutOfMemory();
        return (Result)(ErrorResult *)this;
      }
      datagram->Next = (OutgoingQueuedDatagram *)0x0;
      datagram->NextWriteOffset = 0;
      datagram->CompressionSavings = 0;
      memcpy(datagram->Data,original.Data,(ulong)original.DataBytes);
      datagram->NextWriteOffset = original.DataBytes;
      uVar4 = getPacketNumBytes((SessionOutgoing *)messageSent,original.PacketNum);
      sendQueuedDatagram((SessionOutgoing *)messageSent,datagram,uVar4,original.PacketNum);
      *in_RDX = 1;
    }
    else if (SVar2 != Siamese_NeedMoreData) {
      std::__cxx11::string::string((string *)&local_1b8,"siamese_retransmit failed",&local_1c9);
      pp_Var3 = (_func_int **)operator_new(0x38);
      *pp_Var3 = (_func_int *)"SessionOutgoing::PostRetransmit";
      std::__cxx11::string::string((string *)(pp_Var3 + 1),(string *)&local_1b8);
      *(undefined4 *)(pp_Var3 + 5) = 1;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var3;
      pp_Var3[6] = (_func_int *)(long)(int)SVar2;
      std::__cxx11::string::~string((string *)&local_1b8);
      return (Result)(ErrorResult *)this;
    }
  }
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::PostRetransmit(bool& messageSent)
{
    messageSent = false;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRetransmit ignored before peer address is known");
        return Result::Success();
    }

    // If there is no space left:
    if (Deps.SenderControl->GetAvailableBytes() <= 0) {
        return Result::Success();
    }

    // Get the highest priority packet to retransmit from Siamese
    SiameseOriginalPacket original;
    const int retransmitResult = siamese_encoder_retransmit(
        FECEncoder,
        &original);
    // Note: The returned data is valid until siamese_encoder_ack(),
    // which is only called from this thread.

    // If there is no data to retransmit:
    if (retransmitResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    // If the Siamese call failed:
    if (retransmitResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRetransmit", "siamese_retransmit failed", ErrorType::Siamese, retransmitResult);
    }

    TONK_DEBUG_ASSERT(original.DataBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    /*
        It is not worth trying to embed retransmits with other outgoing data.

        Arguments against:

        (1) Complexity in protocol.
        (2) Complexity in decoder to make sure the data is processed in sequence.
        (3) Complexity to avoid extra delay in delivering the data.
        (4) Often times the original datagram was already max size and cannot
            be clustered anymore.
        (5) We already clustered messages into one big datagram when first sent
            so it's unlikely that we will gain advantage from more clustering.
        (6) Retransmits are even more rare than packet loss rate, so optimizing
            the bandwidth of these rare events is not going to move the needle.
    */

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + original.DataBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    datagram->Initialize();

#ifdef TONK_DETAILED_STATS
    datagram->Stats[Stats_RetransmitSent] += original.DataBytes;
#endif // TONK_DETAILED_STATS

    // Copy data into place
    memcpy(datagram->Data, original.Data, original.DataBytes);
    datagram->NextWriteOffset = original.DataBytes;

    // No need to shrink the queued datagram here because it's already sized for the data

    // Send datagram immediately
    sendQueuedDatagram(
        datagram,
        getPacketNumBytes(original.PacketNum),
        original.PacketNum);

    messageSent = true;

    return Result::Success();
}